

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O0

void __thiscall QToolButtonPrivate::onButtonPressed(QToolButtonPrivate *this)

{
  bool bVar1;
  QToolButtonPrivate *this_00;
  QToolButtonPrivate *in_RDI;
  QBasicTimer *unaff_retaddr;
  QToolButton *q;
  int in_stack_0000001c;
  QToolButtonPrivate *obj;
  
  obj = in_RDI;
  this_00 = (QToolButtonPrivate *)q_func(in_RDI);
  bVar1 = hasMenu(this_00);
  if ((bVar1) && (in_RDI->popupMode != MenuButtonPopup)) {
    if ((in_RDI->delay < 1) || (in_RDI->popupMode != DelayedPopup)) {
      if ((in_RDI->delay == 0) || (in_RDI->popupMode == InstantPopup)) {
        QToolButton::showMenu((QToolButton *)this_00);
      }
    }
    else {
      QBasicTimer::start(unaff_retaddr,in_stack_0000001c,(QObject *)obj);
    }
  }
  return;
}

Assistant:

void QToolButtonPrivate::onButtonPressed()
{
    Q_Q(QToolButton);
    if (!hasMenu())
        return; // no menu to show
    if (popupMode == QToolButton::MenuButtonPopup)
        return;
    else if (delay > 0 && popupMode == QToolButton::DelayedPopup)
        popupTimer.start(delay, q);
    else if (delay == 0 || popupMode == QToolButton::InstantPopup)
        q->showMenu();
}